

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<DomLayout_const*,QString>::findImpl<DomLayout_const*>
          (QHash<DomLayout_const*,QString> *this,DomLayout **key)

{
  Data<QHashPrivate::Node<DomLayout_const*,QString>> *this_00;
  Data<QHashPrivate::Node<const_DomLayout_*,_QString>_> *d;
  ulong uVar1;
  Span *pSVar2;
  Data<QHashPrivate::Node<const_DomLayout_*,_QString>_> *pDVar3;
  Bucket BVar4;
  iterator iVar5;
  
  this_00 = *(Data<QHashPrivate::Node<DomLayout_const*,QString>> **)this;
  if ((this_00 == (Data<QHashPrivate::Node<DomLayout_const*,QString>> *)0x0) ||
     (*(long *)(this_00 + 8) == 0)) {
    d = (Data<QHashPrivate::Node<const_DomLayout_*,_QString>_> *)0x0;
    pDVar3 = (Data<QHashPrivate::Node<const_DomLayout_*,_QString>_> *)0x0;
  }
  else {
    uVar1 = ((*(ulong *)(this_00 + 0x18) ^ (ulong)*key) >> 0x20 ^
            *(ulong *)(this_00 + 0x18) ^ (ulong)*key) * -0x2917014799a6026d;
    uVar1 = (uVar1 >> 0x20 ^ uVar1) * -0x2917014799a6026d;
    BVar4 = QHashPrivate::Data<QHashPrivate::Node<DomLayout_const*,QString>>::
            findBucketWithHash<DomLayout_const*>(this_00,key,uVar1 >> 0x20 ^ uVar1);
    d = *(Data<QHashPrivate::Node<const_DomLayout_*,_QString>_> **)this;
    pSVar2 = d->spans;
    pDVar3 = (Data<QHashPrivate::Node<const_DomLayout_*,_QString>_> *)
             (((ulong)((long)BVar4.span - (long)pSVar2) >> 4) * 0x1c71c71c71c71c80 | BVar4.index);
    if (1 < (uint)(d->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      d = QHashPrivate::Data<QHashPrivate::Node<const_DomLayout_*,_QString>_>::detached(d);
      *(Data<QHashPrivate::Node<const_DomLayout_*,_QString>_> **)this = d;
      pSVar2 = d->spans;
    }
    if (pSVar2[(ulong)pDVar3 >> 7].offsets[(uint)BVar4.index & 0x7f] == 0xff) {
      d = (Data<QHashPrivate::Node<const_DomLayout_*,_QString>_> *)0x0;
      pDVar3 = (Data<QHashPrivate::Node<const_DomLayout_*,_QString>_> *)0x0;
    }
  }
  iVar5.i.bucket = (size_t)pDVar3;
  iVar5.i.d = d;
  return (iterator)iVar5.i;
}

Assistant:

iterator findImpl(const K &key)
    {
        if (isEmpty()) // prevents detaching shared null
            return end();
        auto it = d->findBucket(key);
        size_t bucket = it.toBucketIndex(d);
        detach();
        it = typename Data::Bucket(d, bucket); // reattach in case of detach
        if (it.isUnused())
            return end();
        return iterator(it.toIterator(d));
    }